

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_CubeArrayToBdd(DdManager *dd,int *array)

{
  ulong uVar1;
  DdNode *pDVar2;
  int local_3c;
  int size;
  int i;
  DdNode *tmp;
  DdNode *var;
  DdNode *cube;
  int *array_local;
  DdManager *dd_local;
  
  local_3c = Cudd_ReadSize(dd);
  var = dd->one;
  uVar1 = (ulong)var & 0xfffffffffffffffe;
  *(int *)(uVar1 + 4) = *(int *)(uVar1 + 4) + 1;
  while( true ) {
    do {
      local_3c = local_3c + -1;
      if (local_3c < 0) {
        *(int *)(((ulong)var & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)var & 0xfffffffffffffffe) + 4) + -1;
        return var;
      }
    } while ((array[local_3c] & 0xfffffffeU) != 0);
    pDVar2 = Cudd_bddIthVar(dd,local_3c);
    pDVar2 = Cudd_bddAnd(dd,var,(DdNode *)((ulong)pDVar2 ^ (long)(int)(uint)(array[local_3c] == 0)))
    ;
    if (pDVar2 == (DdNode *)0x0) break;
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,var);
    var = pDVar2;
  }
  Cudd_RecursiveDeref(dd,var);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_CubeArrayToBdd(
  DdManager *dd,
  int *array)
{
    DdNode *cube, *var, *tmp;
    int i;
    int size = Cudd_ReadSize(dd);

    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = size - 1; i >= 0; i--) {
        if ((array[i] & ~1) == 0) {
            var = Cudd_bddIthVar(dd,i);
            tmp = Cudd_bddAnd(dd,cube,Cudd_NotCond(var,array[i]==0));
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,cube);
                return(NULL);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,cube);
            cube = tmp;
        }
    }
    cuddDeref(cube);
    return(cube);

}